

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::ordered_dict<tinyusdz::Relationship>::at
          (ordered_dict<tinyusdz::Relationship> *this,size_t idx,Relationship **dst)

{
  size_type sVar1;
  key_type_conflict *pkVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  Relationship **dst_local;
  size_t idx_local;
  ordered_dict<tinyusdz::Relationship> *this_local;
  
  sVar1 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->_keys);
  if (idx < sVar1) {
    pkVar2 = (key_type_conflict *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)this,idx);
    sVar3 = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
            ::count(&this->_m,pkVar2);
    if (sVar3 == 0) {
      this_local._7_1_ = false;
    }
    else {
      pkVar2 = (key_type_conflict *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)this,idx);
      pmVar4 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
               ::at(&this->_m,pkVar2);
      *dst = pmVar4;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool at(const size_t idx, const T **dst) const {
    if (idx >= _keys.size()) {
      return false;
    }

    if (!_m.count(_keys[idx])) {
      // This should not happen though.
      return false;
    }

    (*dst) = &(_m.at(_keys[idx]));

    return true;
  }